

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cc
# Opt level: O1

void quantize(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *args)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  FastText fasttext;
  Args a;
  string local_190;
  FastText local_170;
  Args local_f8;
  
  ::fasttext::Args::Args(&local_f8);
  if ((ulong)((long)(args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish -
             (long)(args->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start) < 0x41) {
    printQuantizeUsage();
    ::fasttext::Args::printHelp(&local_f8);
    exit(1);
  }
  ::fasttext::Args::parseArgs(&local_f8,args);
  ::fasttext::FastText::FastText(&local_170);
  local_190._M_dataplus._M_p = (pointer)&local_190.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_190,local_f8.output._M_dataplus._M_p,
             local_f8.output._M_dataplus._M_p + local_f8.output._M_string_length);
  std::__cxx11::string::append((char *)&local_190);
  ::fasttext::FastText::loadModel(&local_170,&local_190);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_190._M_dataplus._M_p != &local_190.field_2) {
    operator_delete(local_190._M_dataplus._M_p);
  }
  ::fasttext::FastText::quantize(&local_170,&local_f8);
  std::operator+(&local_190,&local_f8.output,".ftz");
  ::fasttext::FastText::saveModel(&local_170,&local_190);
  std::__cxx11::string::~string((string *)&local_190);
  exit(0);
}

Assistant:

void quantize(const std::vector<std::string>& args) {
  Args a = Args();
  if (args.size() < 3) {
    printQuantizeUsage();
    a.printHelp();
    exit(EXIT_FAILURE);
  }
  a.parseArgs(args);
  FastText fasttext;
  // parseArgs checks if a->output is given.
  fasttext.loadModel(a.output + ".bin");
  fasttext.quantize(a);
  fasttext.saveModel(a.output + ".ftz");
  exit(0);
}